

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.hpp
# Opt level: O3

void __thiscall
Storage::Disk::PCMSegment::PCMSegment(PCMSegment *this,size_t number_of_bits,uint8_t *source)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  ulong in_RAX;
  ulong uVar3;
  ulong uVar4;
  undefined8 uStack_28;
  
  (this->length_of_a_bit).length = 1;
  (this->length_of_a_bit).clock_rate = 1;
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->data,number_of_bits,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  if (number_of_bits != 0) {
    p_Var2 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 0;
    do {
      if ((source[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0) {
        uVar4 = uVar3 + 0x3f;
        if (-1 < (long)uVar3) {
          uVar4 = uVar3;
        }
        puVar1 = p_Var2 + ((long)uVar4 >> 6) +
                          (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff;
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
      uVar3 = uVar3 + 1;
    } while (number_of_bits != uVar3);
  }
  return;
}

Assistant:

PCMSegment(size_t number_of_bits, const uint8_t *source)
		: data(number_of_bits, false) {
		for(size_t c = 0; c < number_of_bits; ++c) {
			if((source[c >> 3] >> (7 ^ (c & 7)))&1) {
				data[c] = true;
			}
		}
	}